

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O1

void lj_lex_next(LexState *ls)

{
  LexToken LVar1;
  
  ls->lastline = ls->linenumber;
  if (ls->lookahead == 0x121) {
    LVar1 = lex_scan(ls,&ls->tokval);
    ls->tok = LVar1;
  }
  else {
    ls->tok = ls->lookahead;
    ls->lookahead = 0x121;
    ls->tokval = ls->lookaheadval;
  }
  return;
}

Assistant:

void lj_lex_next(LexState *ls)
{
  ls->lastline = ls->linenumber;
  if (LJ_LIKELY(ls->lookahead == TK_eof)) {  /* No lookahead token? */
    ls->tok = lex_scan(ls, &ls->tokval);  /* Get next token. */
  } else {  /* Otherwise return lookahead token. */
    ls->tok = ls->lookahead;
    ls->lookahead = TK_eof;
    ls->tokval = ls->lookaheadval;
  }
}